

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_4chan(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  exr_coding_channel_info_t *peVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  void *pvVar18;
  int x;
  long lVar19;
  ulong uVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  uint8_t *local_70;
  uint8_t *local_68;
  uint8_t *local_60;
  
  pvVar11 = decode->unpacked_buffer;
  peVar10 = decode->channels;
  uVar1 = peVar10->width;
  lVar19 = (long)(int)uVar1;
  iVar17 = (decode->chunk).height;
  iVar2 = peVar10->user_pixel_stride;
  iVar3 = peVar10[1].user_pixel_stride;
  iVar4 = peVar10[2].user_pixel_stride;
  iVar5 = peVar10[3].user_pixel_stride;
  iVar6 = peVar10->user_line_stride;
  iVar7 = peVar10[1].user_line_stride;
  iVar8 = peVar10[2].user_line_stride;
  iVar9 = peVar10[3].user_line_stride;
  puVar22 = (peVar10->field_12).decode_to_ptr;
  local_60 = peVar10[1].field_12.decode_to_ptr;
  local_68 = peVar10[2].field_12.decode_to_ptr;
  local_70 = peVar10[3].field_12.decode_to_ptr;
  iVar14 = 0;
  uVar15 = 0;
  if (0 < (int)uVar1) {
    uVar15 = (ulong)uVar1;
  }
  lVar16 = (long)(int)(uVar1 * 8);
  if (iVar17 < 1) {
    iVar17 = 0;
  }
  pvVar18 = (void *)((long)pvVar11 + lVar19 * 2);
  pvVar13 = (void *)((long)pvVar11 + lVar19 * 4);
  pvVar12 = (void *)(lVar19 * 6 + (long)pvVar11);
  for (; iVar14 != iVar17; iVar14 = iVar14 + 1) {
    puVar21 = puVar22;
    for (uVar20 = 0; uVar15 != uVar20; uVar20 = uVar20 + 1) {
      *(undefined2 *)puVar21 = *(undefined2 *)((long)pvVar11 + uVar20 * 2);
      puVar21 = puVar21 + iVar2;
    }
    puVar21 = local_60;
    for (uVar20 = 0; uVar15 != uVar20; uVar20 = uVar20 + 1) {
      *(undefined2 *)puVar21 = *(undefined2 *)((long)pvVar18 + uVar20 * 2);
      puVar21 = puVar21 + iVar3;
    }
    puVar21 = local_68;
    for (uVar20 = 0; uVar15 != uVar20; uVar20 = uVar20 + 1) {
      *(undefined2 *)puVar21 = *(undefined2 *)((long)pvVar13 + uVar20 * 2);
      puVar21 = puVar21 + iVar4;
    }
    puVar21 = local_70;
    for (uVar20 = 0; uVar15 != uVar20; uVar20 = uVar20 + 1) {
      *(undefined2 *)puVar21 = *(undefined2 *)((long)pvVar12 + uVar20 * 2);
      puVar21 = puVar21 + iVar5;
    }
    pvVar11 = (void *)((long)pvVar11 + lVar16);
    puVar22 = puVar22 + iVar6;
    local_60 = local_60 + iVar7;
    local_68 = local_68 + iVar8;
    local_70 = local_70 + iVar9;
    pvVar18 = (void *)((long)pvVar18 + lVar16);
    pvVar13 = (void *)((long)pvVar13 + lVar16);
    pvVar12 = (void *)((long)pvVar12 + lVar16);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t *       out0, *out1, *out2, *out3;
    int             w, h;
    int             inc0, inc1, inc2, inc3;
    int             linc0, linc1, linc2, linc3;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    inc3  = decode->channels[3].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;
    linc3 = decode->channels[3].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;
    out3 = decode->channels[3].decode_to_ptr;

    for (int y = 0; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        in3 = in2 + w;
        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out3 + x * inc3)) = one_to_native16 (in3[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
        out3 += linc3;
    }
    return EXR_ERR_SUCCESS;
}